

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O3

void __thiscall
gmlc::containers::
StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
::blockCheck(StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
             *this)

{
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **__dest;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar1;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *puVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  
  if (0x1f < this->bsize) {
    iVar4 = this->dataSlotsAvailable;
    lVar5 = (long)iVar4;
    if (lVar5 == 0) {
      ppuVar1 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
                operator_new__(0x200);
      this->dataptr = ppuVar1;
      this->dataSlotsAvailable = 0x40;
      this->dataSlotIndex = -1;
    }
    else if (iVar4 + -1 <= this->dataSlotIndex) {
      uVar3 = 0xffffffffffffffff;
      if (-1 < iVar4) {
        uVar3 = lVar5 << 4;
      }
      __dest = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
               operator_new__(uVar3);
      ppuVar1 = this->dataptr;
      memmove(__dest,ppuVar1,lVar5 << 3);
      if (ppuVar1 != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
        operator_delete__(ppuVar1);
        iVar4 = this->dataSlotsAvailable;
      }
      this->dataptr = __dest;
      this->dataSlotsAvailable = iVar4 * 2;
    }
    iVar4 = this->freeIndex;
    if ((long)iVar4 == 0) {
      puVar2 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
               operator_new(0x100);
    }
    else {
      this->freeIndex = iVar4 + -1;
      puVar2 = this->freeblocks[(long)iVar4 + -1];
    }
    iVar4 = this->dataSlotIndex;
    this->dataSlotIndex = iVar4 + 1;
    this->dataptr[(long)iVar4 + 1] = puVar2;
    this->bsize = 0;
  }
  return;
}

Assistant:

void blockCheck()
        {
            if (bsize >= static_cast<int>(blockSize)) {
                if (0 == dataSlotsAvailable) {
                    dataptr = new X*[64];
                    dataSlotsAvailable = 64;
                    dataSlotIndex = -1;
                } else if (dataSlotIndex >= dataSlotsAvailable - 1) {
                    auto mem =
                        new X*[static_cast<size_t>(dataSlotsAvailable) * 2];
                    std::copy(dataptr, dataptr + dataSlotsAvailable, mem);
                    delete[] dataptr;
                    dataptr = mem;
                    dataSlotsAvailable *= 2;
                }
                dataptr[++dataSlotIndex] = getNewBlock();
                bsize = 0;
            }
        }